

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_plt_string(FILE *file,char *string,int maxlen)

{
  size_t sVar1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_28;
  int letter;
  int i;
  int maxlen_local;
  char *string_local;
  FILE *file_local;
  
  local_28 = 0;
  letter = maxlen;
  _i = string;
  string_local = (char *)file;
  while( true ) {
    if (letter <= local_28) {
      return 1;
    }
    sVar1 = fread((void *)((long)&ref_private_status_reis_ai + 4),4,1,(FILE *)string_local);
    if (sVar1 != 1) break;
    _i[local_28] = (char)ref_private_status_reis_ai._4_4_;
    if (ref_private_status_reis_ai._4_4_ == 0) {
      return 0;
    }
    local_28 = local_28 + 1;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8fe,
         "ref_part_plt_string","plt string letter",1,sVar1);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_string(FILE *file, char *string,
                                              int maxlen) {
  int i, letter;
  for (i = 0; i < maxlen; i++) {
    REIS(1, fread(&letter, sizeof(int), 1, file), "plt string letter");
    string[i] = (char)letter;
    if (0 == letter) {
      return REF_SUCCESS;
    }
  }
  return REF_FAILURE;
}